

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Packet.cpp
# Opt level: O0

Packet * __thiscall mognetwork::Packet::operator>>(Packet *this,string *data)

{
  Packet *in_RDI;
  char *buffer;
  int32_t size;
  int *in_stack_ffffffffffffffc8;
  Packet *in_stack_ffffffffffffffd0;
  
  operator>>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  return in_RDI;
}

Assistant:

Packet& Packet::operator>>(std::string& data)
  {
    int32_t size = 0;
    *this >> size;

    if (size > 0 && verifySize(size))
      {
	char *buffer = new char[size + 1];
	memcpy(buffer, &((*m_data)[m_readerPos]), size);
	buffer[size] = '\0';
	m_readerPos += size;
	data.append(buffer);
	delete buffer;
      }
    return (*this);
  }